

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

string * __thiscall re2::Prog::DumpByteMap_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    iVar3 = (int)uVar4;
    uVar5 = iVar3 - 1;
    lVar2 = (long)iVar3;
    do {
      if (0xfe < lVar2) {
        uVar5 = 0xff;
        break;
      }
      uVar5 = uVar5 + 1;
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (this->bytemap_[lVar1] == this->bytemap_[iVar3]);
    StringAppendF(__return_storage_ptr__,"[%02x-%02x] -> %d\n",uVar4,(ulong)uVar5);
    uVar4 = (ulong)(uVar5 + 1);
    if (0xfe < (int)uVar5) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string Prog::DumpByteMap() {
  string map;
  for (int c = 0; c < 256; c++) {
    int b = bytemap_[c];
    int lo = c;
    while (c < 256-1 && bytemap_[c+1] == b)
      c++;
    int hi = c;
    StringAppendF(&map, "[%02x-%02x] -> %d\n", lo, hi, b);
  }
  return map;
}